

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O1

void __thiscall cmCTestSVN::ExternalParser::DoPath(ExternalParser *this,string *path)

{
  ulong __n;
  cmCTestSVN *pcVar1;
  int iVar2;
  list<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_> *__position;
  char *pcVar3;
  string local_path;
  char *local_108;
  undefined8 local_100;
  char local_f8;
  undefined7 uStack_f7;
  SVNInfo local_e8;
  
  local_100 = 0;
  local_f8 = '\0';
  __n = (this->SVN->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory._M_string_length;
  local_108 = &local_f8;
  if (__n < path->_M_string_length) {
    pcVar3 = (path->_M_dataplus)._M_p;
    iVar2 = strncmp(pcVar3,(this->SVN->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory.
                           _M_dataplus._M_p,__n);
    if (iVar2 == 0) {
      pcVar3 = pcVar3 + __n + 1;
      strlen(pcVar3);
      std::__cxx11::string::_M_replace((ulong)&local_108,0,(char *)0x0,(ulong)pcVar3);
      goto LAB_002d74db;
    }
  }
  std::__cxx11::string::_M_assign((string *)&local_108);
LAB_002d74db:
  pcVar1 = this->SVN;
  SVNInfo::SVNInfo(&local_e8,local_108);
  __position = &pcVar1->Repositories;
  std::__cxx11::list<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>::
  _M_insert<cmCTestSVN::SVNInfo>(__position,(iterator)__position,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.NewRevision._M_dataplus._M_p != &local_e8.NewRevision.field_2) {
    operator_delete(local_e8.NewRevision._M_dataplus._M_p,
                    local_e8.NewRevision.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.OldRevision._M_dataplus._M_p != &local_e8.OldRevision.field_2) {
    operator_delete(local_e8.OldRevision._M_dataplus._M_p,
                    local_e8.OldRevision.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.Base._M_dataplus._M_p != &local_e8.Base.field_2) {
    operator_delete(local_e8.Base._M_dataplus._M_p,local_e8.Base.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.Root._M_dataplus._M_p != &local_e8.Root.field_2) {
    operator_delete(local_e8.Root._M_dataplus._M_p,local_e8.Root.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.URL._M_dataplus._M_p != &local_e8.URL.field_2) {
    operator_delete(local_e8.URL._M_dataplus._M_p,local_e8.URL.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.LocalPath._M_dataplus._M_p != &local_e8.LocalPath.field_2) {
    operator_delete(local_e8.LocalPath._M_dataplus._M_p,
                    local_e8.LocalPath.field_2._M_allocated_capacity + 1);
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108,CONCAT71(uStack_f7,local_f8) + 1);
  }
  return;
}

Assistant:

void DoPath(std::string const& path)
    {
    // Get local path relative to the source directory
    std::string local_path;
    if(path.size() > this->SVN->SourceDirectory.size() &&
       strncmp(path.c_str(), this->SVN->SourceDirectory.c_str(),
               this->SVN->SourceDirectory.size()) == 0)
      {
      local_path = path.c_str() + this->SVN->SourceDirectory.size() + 1;
      }
    else
      {
      local_path = path;
      }
    this->SVN->Repositories.push_back( SVNInfo(local_path.c_str()) );
    }